

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O3

OSObject * __thiscall OSToken::createObject(OSToken *this)

{
  ObjectFile *pOVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int inUmask;
  pointer pcVar3;
  long *plVar4;
  ObjectFile *pOVar5;
  size_type *psVar6;
  undefined1 local_110 [32];
  string lockPath;
  string objectPath;
  MutexLocker lock;
  _func_int *local_a0 [2];
  string objectUUID;
  string local_70;
  string local_50;
  
  if (this->valid == true) {
    UUID::newUUID_abi_cxx11_();
    pOVar1 = (ObjectFile *)(local_110 + 0x10);
    pcVar3 = (this->tokenPath)._M_dataplus._M_p;
    local_110._0_8_ = pOVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_110,pcVar3,pcVar3 + (this->tokenPath)._M_string_length);
    std::__cxx11::string::append(local_110);
    plVar4 = (long *)std::__cxx11::string::_M_append(local_110,(ulong)objectUUID._M_dataplus._M_p);
    paVar2 = &lockPath.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lockPath.field_2._M_allocated_capacity = *psVar6;
      lockPath.field_2._8_8_ = plVar4[3];
      lockPath._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      lockPath.field_2._M_allocated_capacity = *psVar6;
      lockPath._M_dataplus._M_p = (pointer)*plVar4;
    }
    lockPath._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&lockPath);
    objectPath._M_dataplus._M_p = (pointer)&objectPath.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      objectPath.field_2._M_allocated_capacity = *psVar6;
      objectPath.field_2._8_8_ = plVar4[3];
    }
    else {
      objectPath.field_2._M_allocated_capacity = *psVar6;
      objectPath._M_dataplus._M_p = (pointer)*plVar4;
    }
    objectPath._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)lockPath._M_dataplus._M_p != paVar2) {
      operator_delete(lockPath._M_dataplus._M_p);
    }
    if ((ObjectFile *)local_110._0_8_ != pOVar1) {
      operator_delete((void *)local_110._0_8_);
    }
    pcVar3 = (this->tokenPath)._M_dataplus._M_p;
    lock._vptr_MutexLocker = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&lock,pcVar3,pcVar3 + (this->tokenPath)._M_string_length);
    std::__cxx11::string::append((char *)&lock);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&lock,(ulong)objectUUID._M_dataplus._M_p);
    pOVar5 = (ObjectFile *)(plVar4 + 2);
    if ((ObjectFile *)*plVar4 == pOVar5) {
      local_110._16_8_ = (pOVar5->super_OSObject)._vptr_OSObject;
      local_110._24_8_ = plVar4[3];
      local_110._0_8_ = pOVar1;
    }
    else {
      local_110._16_8_ = (pOVar5->super_OSObject)._vptr_OSObject;
      local_110._0_8_ = (ObjectFile *)*plVar4;
    }
    local_110._8_8_ = plVar4[1];
    *plVar4 = (long)pOVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_110);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lockPath.field_2._M_allocated_capacity = *psVar6;
      lockPath.field_2._8_8_ = plVar4[3];
      lockPath._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      lockPath.field_2._M_allocated_capacity = *psVar6;
      lockPath._M_dataplus._M_p = (pointer)*plVar4;
    }
    lockPath._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((ObjectFile *)local_110._0_8_ != pOVar1) {
      operator_delete((void *)local_110._0_8_);
    }
    if (lock._vptr_MutexLocker != local_a0) {
      operator_delete(lock._vptr_MutexLocker);
    }
    pOVar5 = (ObjectFile *)operator_new(0xb0);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,objectPath._M_dataplus._M_p,
               objectPath._M_dataplus._M_p + objectPath._M_string_length);
    inUmask = this->umask;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,lockPath._M_dataplus._M_p,
               lockPath._M_dataplus._M_p + lockPath._M_string_length);
    ObjectFile::ObjectFile(pOVar5,this,&local_50,inUmask,&local_70,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (pOVar5->valid == false) {
      softHSMLog(3,"createObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x165,"Failed to create new object %s",objectPath._M_dataplus._M_p);
      (*(pOVar5->super_OSObject)._vptr_OSObject[1])(pOVar5);
      pOVar5 = (ObjectFile *)0x0;
    }
    else {
      MutexLocker::MutexLocker(&lock,this->tokenMutex);
      local_110._0_8_ = pOVar5;
      std::
      _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
      ::_M_insert_unique<OSObject*>
                ((_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                  *)&this->objects,(OSObject **)local_110);
      local_110._0_8_ = pOVar5;
      std::
      _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
      ::_M_insert_unique<OSObject*>
                ((_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                  *)&this->allObjects,(OSObject **)local_110);
      ObjectFile::getFilename_abi_cxx11_((string *)local_110,pOVar5);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->currentFiles,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
      if ((ObjectFile *)local_110._0_8_ != pOVar1) {
        operator_delete((void *)local_110._0_8_);
      }
      softHSMLog(7,"createObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x173,"(0x%08X) Created new object %s (0x%08X)",this,objectPath._M_dataplus._M_p,
                 pOVar5);
      Generation::update(this->gen);
      Generation::commit(this->gen);
      MutexLocker::~MutexLocker(&lock);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)lockPath._M_dataplus._M_p != &lockPath.field_2) {
      operator_delete(lockPath._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objectPath._M_dataplus._M_p != &objectPath.field_2) {
      operator_delete(objectPath._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objectUUID._M_dataplus._M_p != &objectUUID.field_2) {
      operator_delete(objectUUID._M_dataplus._M_p);
    }
  }
  else {
    pOVar5 = (ObjectFile *)0x0;
  }
  return &pOVar5->super_OSObject;
}

Assistant:

OSObject* OSToken::createObject()
{
	if (!valid) return NULL;

	// Generate a name for the object
	std::string objectUUID = UUID::newUUID();
	std::string objectPath = tokenPath + OS_PATHSEP + objectUUID + ".object";
	std::string lockPath = tokenPath + OS_PATHSEP + objectUUID + ".lock";

	// Create the new object file
	ObjectFile* newObject = new ObjectFile(this, objectPath, umask, lockPath, true);

	if (!newObject->valid)
	{
		ERROR_MSG("Failed to create new object %s", objectPath.c_str());

		delete newObject;

		return NULL;
	}

	// Now add it to the set of objects
	MutexLocker lock(tokenMutex);

	objects.insert(newObject);
	allObjects.insert(newObject);
	currentFiles.insert(newObject->getFilename());

	DEBUG_MSG("(0x%08X) Created new object %s (0x%08X)", this, objectPath.c_str(), newObject);

	gen->update();

	gen->commit();

	return newObject;
}